

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void lws_cache_heap_item_destroy
               (lws_cache_ttl_lru_t_heap_t *cache,lws_cache_ttl_item_heap_t *item,int parent_too)

{
  lws_dll2 *plVar1;
  size_t sVar2;
  lws_dll2_t *plVar3;
  uint32_t uVar4;
  int iVar5;
  char *pcVar6;
  lws_cache_ttl_item_heap_t *item_00;
  char *__s;
  size_t sVar7;
  uint32_t tlen;
  size_t taglen;
  uint8_t *end;
  uint8_t *pay;
  char *iname;
  lws_cache_ttl_item_heap_t *i;
  lws_dll2 *d1;
  lws_dll2 *d;
  char *tag;
  lws_cache_ttl_lru *backing;
  int parent_too_local;
  lws_cache_ttl_item_heap_t *item_local;
  lws_cache_ttl_lru_t_heap_t *cache_local;
  
  pcVar6 = (char *)((long)&item[1].list_expiry.prev + item->size);
  if (*pcVar6 != '!') {
    tag = (char *)cache;
    if ((cache->cache).info.parent != (lws_cache_ttl_lru *)0x0) {
      tag = (char *)(cache->cache).info.parent;
    }
    d1 = (cache->items_lru).head;
    while (d1 != (lws_dll2 *)0x0) {
      plVar1 = d1->next;
      item_00 = (lws_cache_ttl_item_heap_t *)(d1 + -1);
      __s = (char *)((long)&item[1].list_expiry.prev + item->size);
      end = (uint8_t *)(item + 1);
      sVar2 = item->size;
      plVar3 = &((lws_cache_ttl_item_heap_t *)end)->list_expiry;
      d1 = plVar1;
      if (*__s == '!') {
        sVar7 = strlen(__s);
        for (; end < (uint8_t *)((long)&plVar3->prev + sVar2); end = end + (uVar4 + 9)) {
          uVar4 = lws_ser_ru32be(end + 4);
          if ((uVar4 == sVar7) && (iVar5 = strcmp((char *)(end + 8),__s), iVar5 == 0)) {
            iVar5 = (**(code **)(*(long *)(tag + 0x20) + 0x20))(tag,__s + 1,pcVar6,1);
            if (iVar5 != 0) {
              __assert_fail("!backing->info.ops->tag_match( backing, iname + 1, tag, 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/heap.c"
                            ,0x7f,
                            "void lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *, lws_cache_ttl_item_heap_t *, int)"
                           );
            }
            _lws_cache_heap_item_destroy(cache,item_00);
            break;
          }
        }
        iVar5 = (**(code **)(*(long *)(tag + 0x20) + 0x20))(tag,__s + 1,pcVar6,1);
        if (iVar5 == 0) {
          __assert_fail("backing->info.ops->tag_match(backing, iname + 1, tag, 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/heap.c"
                        ,0x8e,
                        "void lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *, lws_cache_ttl_item_heap_t *, int)"
                       );
        }
      }
    }
  }
  _lws_cache_heap_item_destroy(cache,item);
  return;
}

Assistant:

static void
lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *cache,
			    lws_cache_ttl_item_heap_t *item, int parent_too)
{
	struct lws_cache_ttl_lru *backing = &cache->cache;
	const char *tag = ((const char *)&item[1]) + item->size;

	/*
	 * We're destroying a normal item?
	 */

	if (*tag == META_ITEM_LEADING)
		/* no, nothing to check here then */
		goto post;

	if (backing->info.parent)
		backing = backing->info.parent;

	/*
	 * We need to check any cached meta-results from lookups that
	 * include this normal item, and if any, invalidate the meta-results
	 * since they have to be recalculated before being used again.
	 */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   cache->items_lru.head) {
		lws_cache_ttl_item_heap_t *i = lws_container_of(d,
						lws_cache_ttl_item_heap_t,
						list_lru);
		const char *iname = ((const char *)&item[1]) + item->size;
		uint8_t *pay = (uint8_t *)&item[1], *end = pay + item->size;

		if (*iname == META_ITEM_LEADING) {
			size_t taglen = strlen(iname);

			/*
			 * If the item about to be destroyed makes an
			 * appearance on the meta results list, we must kill
			 * the meta result item to force recalc next time
			 */

			while (pay < end) {
				uint32_t tlen = lws_ser_ru32be(pay + 4);

				if (tlen == taglen &&
				    !strcmp((const char *)pay + 8, iname)) {
#if defined(_DEBUG)
					/*
					 * Sanity check that the item tag is
					 * really a match for that meta results
					 * item
					 */

					assert (!backing->info.ops->tag_match(
						 backing, iname + 1, tag, 1));
#endif
					_lws_cache_heap_item_destroy(cache, i);
					break;
				}
				pay += 8 + tlen + 1;
			}

#if defined(_DEBUG)
			/*
			 * Sanity check that the item tag really isn't a match
			 * for that meta results item
			 */

			assert (backing->info.ops->tag_match(backing, iname + 1,
							  tag, 1));
#endif
		}

	} lws_end_foreach_dll_safe(d, d1);

post:
	_lws_cache_heap_item_destroy(cache, item);
}